

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResultToJUnit.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _Alloc_hider _Var1;
  Writer *pWVar2;
  Error *pEVar3;
  CommandLine cmdLine;
  ifstream in;
  uint local_1050;
  Writer writer;
  ofstream out;
  int aiStack_cb0 [120];
  ResultToJUnitHandler handler;
  TestLogParser parser;
  string local_828 [64];
  
  cmdLine.batchResultFile._M_dataplus._M_p = (pointer)&cmdLine.batchResultFile.field_2;
  cmdLine.batchResultFile._M_string_length = 0;
  cmdLine.batchResultFile.field_2._M_local_buf[0] = '\0';
  cmdLine.outputFile._M_dataplus._M_p = (pointer)&cmdLine.outputFile.field_2;
  cmdLine.outputFile._M_string_length = 0;
  cmdLine.outputFile.field_2._M_local_buf[0] = '\0';
  if (argc != 3) {
    pEVar3 = (Error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_828,"Expected input and output paths",(allocator<char> *)&in);
    xe::Error::Error(pEVar3,local_828);
    __cxa_throw(pEVar3,&xe::Error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::assign((char *)&cmdLine);
  std::__cxx11::string::assign((char *)&cmdLine.outputFile);
  _Var1 = cmdLine.batchResultFile._M_dataplus;
  std::ofstream::ofstream(&out,cmdLine.outputFile._M_dataplus._M_p,_S_bin);
  xe::xml::Writer::Writer(&writer,(ostream *)&out);
  ResultToJUnitHandler::ResultToJUnitHandler(&handler,&writer);
  xe::TestLogParser::TestLogParser(&parser,&handler.super_TestLogHandler);
  if (*(int *)((long)aiStack_cb0 + *(long *)(_out + -0x18)) != 0) {
    pEVar3 = (Error *)__cxa_allocate_exception(0x10);
    xe::Error::Error(pEVar3,(char *)0x0,"out.good()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/tools/xeBatchResultToJUnit.cpp"
                     ,0x8f);
    __cxa_throw(pEVar3,&xe::Error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::operator<<((ostream *)&out,"<?xml version=\"1.0\" encoding=\"utf-8\"?>\n");
  xe::xml::Writer::BeginElement::BeginElement((BeginElement *)local_828,"testsuites");
  pWVar2 = xe::xml::Writer::operator<<(&writer,(BeginElement *)local_828);
  xe::xml::Writer::BeginElement::BeginElement((BeginElement *)&in,"testsuite");
  xe::xml::Writer::operator<<(pWVar2,(BeginElement *)&in);
  std::__cxx11::string::~string((string *)&in);
  std::__cxx11::string::~string((string *)local_828);
  std::ifstream::ifstream(&in,_Var1._M_p,_S_bin);
  do {
    std::istream::read((char *)&in,(long)local_828);
    if ((int)local_1050 < 1) break;
    xe::TestLogParser::parse(&parser,(deUint8 *)local_828,(ulong)(local_1050 & 0x7fffffff));
  } while (0x7ff < local_1050);
  std::ifstream::~ifstream(&in);
  pWVar2 = xe::xml::Writer::operator<<(&writer,(EndElementType *)&xe::xml::Writer::EndElement);
  xe::xml::Writer::operator<<(pWVar2,(EndElementType *)&xe::xml::Writer::EndElement);
  xe::TestLogParser::~TestLogParser(&parser);
  ResultToJUnitHandler::~ResultToJUnitHandler(&handler);
  xe::xml::Writer::~Writer(&writer);
  std::ofstream::~ofstream(&out);
  CommandLine::~CommandLine(&cmdLine);
  return 0;
}

Assistant:

int main (int argc, const char* const* argv)
{
	CommandLine cmdLine;
	try
	{
		parseCommandLine(cmdLine, argc, argv);
	}
	catch (const std::exception&)
	{
		printHelp(argv[0]);
		return -1;
	}

	try
	{
		batchResultToJUnitReport(cmdLine.batchResultFile.c_str(), cmdLine.outputFile.c_str());
	}
	catch (const std::exception& e)
	{
		printf("%s\n", e.what());
		return -1;
	}

	return 0;
}